

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O3

void DepParserTask::convert_to_onelearner_actions
               (search *sch,v_array<unsigned_int> *actions,v_array<unsigned_int> *actions_onelearner
               ,uint32_t left_label,uint32_t right_label)

{
  void *pvVar1;
  ulong uVar2;
  undefined8 in_RAX;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uStack_38;
  
  pvVar1 = sch->task_data;
  uStack_38 = in_RAX;
  v_array<unsigned_int>::clear(actions_onelearner);
  puVar3 = actions->_begin;
  lVar6 = (long)actions->_end - (long)puVar3;
  puVar4 = puVar3;
  if (lVar6 != 0) {
    uVar7 = lVar6 >> 2;
    if (*puVar3 != 1) {
      uVar2 = 1;
      do {
        uVar8 = uVar2;
        if (uVar7 + (uVar7 == 0) == uVar8) break;
        uVar2 = uVar8 + 1;
      } while (puVar3[uVar8] != 1);
      puVar4 = actions->_end;
      if (uVar7 <= uVar8) goto LAB_002682a3;
    }
    v_array<unsigned_int>::push_back(actions_onelearner,&SHIFT);
    puVar3 = actions->_begin;
    puVar4 = actions->_end;
  }
LAB_002682a3:
  if ((*(int *)((long)pvVar1 + 0x2c4) == 2) && ((long)puVar4 - (long)puVar3 != 0)) {
    uVar7 = (long)puVar4 - (long)puVar3 >> 2;
    if (*puVar3 != 4) {
      uVar2 = 1;
      do {
        uVar8 = uVar2;
        if (uVar7 + (uVar7 == 0) == uVar8) break;
        uVar2 = uVar8 + 1;
      } while (puVar3[uVar8] != 4);
      if (uVar7 <= uVar8) goto LAB_00268309;
    }
    uStack_38 = CONCAT44(*(int *)((long)pvVar1 + 0x10) * 2 + 2,(undefined4)uStack_38);
    v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
    puVar3 = actions->_begin;
    puVar4 = actions->_end;
  }
LAB_00268309:
  uVar7 = (long)puVar4 - (long)puVar3 >> 2;
  if (left_label != 9999999) {
    if (puVar4 != puVar3) {
      if (*puVar3 != 2) {
        uVar2 = 1;
        do {
          uVar8 = uVar2;
          if (uVar7 + (uVar7 == 0) == uVar8) break;
          uVar2 = uVar8 + 1;
        } while (puVar3[uVar8] != 2);
        if (uVar7 <= uVar8) goto LAB_00268480;
      }
      uStack_38 = CONCAT44(right_label + 1,(undefined4)uStack_38);
      v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
      puVar3 = actions->_begin;
      puVar4 = actions->_end;
      uVar7 = (long)puVar4 - (long)puVar3 >> 2;
    }
LAB_00268480:
    if (puVar4 == puVar3) {
      return;
    }
    if (*puVar3 != 3) {
      uVar2 = 1;
      do {
        uVar8 = uVar2;
        if (uVar7 + (uVar7 == 0) == uVar8) break;
        uVar2 = uVar8 + 1;
      } while (puVar3[uVar8] != 3);
      if (uVar7 <= uVar8) {
        return;
      }
    }
    uStack_38 = CONCAT44(*(int *)((long)pvVar1 + 0x10) + left_label + 1,(undefined4)uStack_38);
    v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
    return;
  }
  if (puVar4 != puVar3) {
    if (*puVar3 != 2) {
      uVar2 = 1;
      do {
        uVar8 = uVar2;
        if (uVar7 + (uVar7 == 0) == uVar8) break;
        uVar2 = uVar8 + 1;
      } while (puVar3[uVar8] != 2);
      if (uVar7 <= uVar8) goto LAB_00268399;
    }
    uVar5 = *(uint *)((long)pvVar1 + 0x10);
    if (uVar5 != 0) {
      uVar7 = 0;
      do {
        if (uVar7 != *(long *)((long)pvVar1 + 8) - 1U) {
          uStack_38 = CONCAT44((int)uVar7 + 2,(undefined4)uStack_38);
          v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
          uVar5 = *(uint *)((long)pvVar1 + 0x10);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar5);
      puVar3 = actions->_begin;
      puVar4 = actions->_end;
    }
  }
LAB_00268399:
  if ((long)puVar4 - (long)puVar3 != 0) {
    uVar7 = (long)puVar4 - (long)puVar3 >> 2;
    if (*puVar3 != 3) {
      uVar2 = 1;
      do {
        uVar8 = uVar2;
        if (uVar7 + (uVar7 == 0) == uVar8) break;
        uVar2 = uVar8 + 1;
      } while (puVar3[uVar8] != 3);
      if (uVar7 <= uVar8) {
        return;
      }
    }
    uVar5 = *(uint *)((long)pvVar1 + 0x10);
    if (uVar5 != 0) {
      uVar7 = 0;
      do {
        if ((*(int *)((long)pvVar1 + 0x2c4) == 2) || (uVar7 != *(long *)((long)pvVar1 + 8) - 1U)) {
          uStack_38 = CONCAT44(uVar5 + (int)uVar7 + 2,(undefined4)uStack_38);
          v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
          uVar5 = *(uint *)((long)pvVar1 + 0x10);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar5);
    }
  }
  return;
}

Assistant:

void convert_to_onelearner_actions(Search::search &sch, v_array<action> &actions, v_array<action> &actions_onelearner,
    uint32_t left_label, uint32_t right_label)
{
  task_data *data = sch.get_task_data<task_data>();
  uint32_t &sys = data->transition_system;
  uint32_t &num_label = data->num_label;
  actions_onelearner.clear();
  if (is_valid(SHIFT, actions))
    actions_onelearner.push_back(SHIFT);
  if (sys == arc_eager && is_valid(REDUCE, actions))
    actions_onelearner.push_back(2 + 2 * num_label);
  if (left_label != my_null && is_valid(REDUCE_RIGHT, actions))
    actions_onelearner.push_back(1 + right_label);
  if (left_label != my_null && is_valid(REDUCE_LEFT, actions))
    actions_onelearner.push_back(1 + left_label + num_label);
  if (left_label == my_null && is_valid(REDUCE_RIGHT, actions))
    for (uint32_t i = 0; i < num_label; i++)
      if (i != data->root_label - 1)
        actions_onelearner.push_back(i + 2);
  if (left_label == my_null && is_valid(REDUCE_LEFT, actions))
    for (uint32_t i = 0; i < num_label; i++)
      if (sys == arc_eager || i != data->root_label - 1)
        actions_onelearner.push_back((uint32_t)(i + 2 + num_label));
}